

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * chaiscript::exception::eval_error::format
                   (string *t_why,
                   vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                   *t_parameters,bool t_dot_notation,Dispatch_Engine *t_ss)

{
  ostream *poVar1;
  byte in_CL;
  string *in_RDI;
  Dispatch_Engine *in_stack_00000018;
  bool in_stack_00000027;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *in_stack_00000028;
  stringstream ss;
  string local_200 [24];
  string *in_stack_fffffffffffffe18;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [391];
  byte local_19;
  
  local_19 = in_CL & 1;
  std::__cxx11::stringstream::stringstream(local_1b0);
  format_why(in_stack_fffffffffffffe18);
  std::operator<<(local_1a0,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::operator<<(local_1a0," ");
  poVar1 = std::operator<<(local_1a0,"With parameters: ");
  format_parameters_abi_cxx11_(in_stack_00000028,in_stack_00000027,in_stack_00000018);
  std::operator<<(poVar1,local_200);
  std::__cxx11::string::~string(local_200);
  std::operator<<(local_1a0," ");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return in_RDI;
}

Assistant:

static std::string format(const std::string &t_why, 
          const std::vector<Boxed_Value> &t_parameters, 
          bool t_dot_notation,
          const chaiscript::detail::Dispatch_Engine &t_ss)
      {
        std::stringstream ss;

        ss << format_why(t_why);
        ss << " ";

        ss << "With parameters: " << format_parameters(t_parameters, t_dot_notation, t_ss);
        ss << " ";

        return ss.str();
      }